

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linalg.h
# Opt level: O3

mat<double,_4,_4> * linalg::adjugate<double>(mat<double,_4,_4> *a)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  undefined8 uVar7;
  undefined8 uVar9;
  undefined1 auVar8 [16];
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  mat<double,_4,_4> *in_RDI;
  double dVar24;
  double dVar25;
  double dStack_290;
  double dStack_220;
  double dStack_190;
  double dStack_80;
  double dStack_50;
  
  dVar20 = (a->z).y;
  dVar21 = (a->z).z;
  dVar22 = (a->w).y;
  dVar23 = (a->w).z;
  dVar1 = (a->x).y;
  dVar2 = (a->x).z;
  uVar7 = (a->y).y;
  uVar9 = (a->y).z;
  dVar3 = (a->w).w;
  dVar4 = (a->y).w;
  auVar11._8_4_ = (int)uVar9;
  auVar11._0_8_ = dVar23;
  auVar11._12_4_ = (int)((ulong)uVar9 >> 0x20);
  auVar12._8_4_ = SUB84(dVar4,0);
  auVar12._0_8_ = dVar3;
  auVar12._12_4_ = (int)((ulong)dVar4 >> 0x20);
  auVar8 = *(undefined1 (*) [16])&(a->x).w;
  dVar24 = auVar8._0_8_;
  dVar25 = auVar8._8_8_;
  auVar13._8_4_ = auVar8._8_4_;
  auVar13._0_8_ = dVar4;
  auVar13._12_4_ = auVar8._12_4_;
  auVar8 = *(undefined1 (*) [16])&(a->z).w;
  dVar10 = auVar8._0_8_;
  dVar17 = auVar8._8_8_;
  auVar14._8_4_ = auVar8._8_4_;
  auVar14._0_8_ = uVar7;
  auVar14._12_4_ = auVar8._12_4_;
  dVar5 = (a->z).x;
  dVar6 = (a->x).x;
  dStack_50 = auVar13._8_8_;
  auVar8._8_4_ = SUB84(dVar1,0);
  auVar8._0_8_ = dVar1;
  auVar8._12_4_ = (int)((ulong)dVar1 >> 0x20);
  dStack_190 = auVar12._8_8_;
  dStack_220 = auVar11._8_8_;
  dStack_290 = auVar8._8_8_;
  (in_RDI->x).x =
       ((dVar23 * dVar20 * dVar4 + (double)uVar7 * dVar21 * dVar3 + dVar22 * (double)uVar9 * dVar10
        + dVar10 * -(double)uVar7 * dVar23) - dVar3 * dVar20 * (double)uVar9) -
       dVar4 * dVar21 * dVar22;
  (in_RDI->x).y =
       ((dVar22 * dVar21 * dVar24 + dVar23 * dVar1 * dVar10 + dVar20 * dVar2 * dVar3 +
        dVar10 * -dVar22 * dVar2) - dVar24 * dVar20 * dVar23) - dVar3 * dVar21 * dVar1;
  (in_RDI->x).z =
       -dVar22 * (double)uVar9 * dVar24 +
       (((dVar23 * (double)uVar7 * dVar24 + (double)uVar9 * dVar1 * dVar3 + dVar22 * dVar2 * dVar4)
        - dVar23 * dVar1 * dVar4) - dVar2 * (double)uVar7 * dVar3);
  (in_RDI->x).w =
       dVar21 * -(double)uVar7 * dVar24 +
       (((dVar20 * (double)uVar9 * dVar24 +
         dVar21 * dVar1 * dStack_190 + (double)uVar7 * dVar2 * dVar10) -
        dStack_220 * dStack_290 * dVar10) - dVar2 * dVar20 * dStack_190);
  dVar18 = (((dVar10 * dVar23 * dVar25 + dVar3 * (double)uVar9 * dVar5 + dVar21 * dVar4 * dVar17) -
            dVar10 * (double)uVar9 * dVar17) - dVar4 * dVar23 * dVar5) - dVar3 * dVar21 * dVar25;
  dVar19 = (((dVar3 * dVar21 * dVar6 + dVar10 * dVar2 * dVar17 + dVar23 * dVar24 * dVar5) -
            dVar3 * dVar2 * dVar5) - dVar24 * dVar21 * dVar17) - dVar10 * dVar23 * dVar6;
  auVar15._8_4_ = SUB84(dVar19,0);
  auVar15._0_8_ = dVar18;
  auVar15._12_4_ = (int)((ulong)dVar19 >> 0x20);
  (in_RDI->y).x = dVar18;
  (in_RDI->y).y = (double)auVar15._8_8_;
  (in_RDI->y).z =
       -(double)uVar9 * dVar3 * dVar6 +
       -dVar23 * dVar24 * dVar25 +
       ((dVar23 * dVar4 * dVar6 + dVar3 * dVar2 * dVar25 + (double)uVar9 * dVar24 * dVar17) -
       dVar4 * dVar2 * dVar17);
  (in_RDI->y).w =
       -dVar21 * dStack_190 * dVar6 +
       -(double)uVar9 * dVar24 * dVar5 +
       ((dStack_220 * dVar10 * dVar6 + dStack_190 * dVar2 * dVar5 + dVar21 * dVar24 * dVar25) -
       dVar10 * dVar2 * dVar25);
  (in_RDI->z).x =
       (((dVar10 * dVar17 * (double)uVar7 + dVar4 * dVar5 * dVar22 + dVar3 * dVar25 * dVar20) -
        dVar17 * dVar4 * dVar20) - dVar10 * dVar25 * dVar22) - dVar3 * dVar5 * (double)uVar7;
  (in_RDI->z).y =
       (((dVar3 * dVar5 * dVar1 + dVar24 * dVar17 * dVar20 + dVar10 * dVar6 * dVar22) -
        dVar5 * dVar24 * dVar22) - dVar3 * dVar6 * dVar20) - dVar10 * dVar17 * dVar1;
  (in_RDI->z).z =
       -dVar3 * dVar25 * dVar1 +
       -dVar4 * dVar6 * dVar22 +
       ((dVar17 * dVar4 * dVar1 + dVar24 * dVar25 * dVar22 + dVar3 * dVar6 * (double)uVar7) -
       dVar24 * dVar17 * (double)uVar7);
  (in_RDI->z).w =
       -dVar4 * dVar5 * dStack_290 +
       -dVar10 * dVar6 * (double)uVar7 +
       ((dVar10 * dStack_50 * dStack_290 +
        dVar5 * dVar24 * (double)uVar7 + dStack_190 * dVar6 * dVar20) - dVar24 * dVar25 * dVar20);
  dStack_80 = auVar14._8_8_;
  dVar3 = (((dVar20 * dVar17 * (double)uVar9 +
            dVar22 * dVar25 * dVar21 + dVar5 * (double)uVar7 * dVar23) - dVar25 * dVar20 * dVar23) -
          dVar17 * (double)uVar7 * dVar21) - dVar5 * dVar22 * (double)uVar9;
  dVar4 = (((dVar22 * dVar5 * dVar2 + dVar20 * dVar6 * dVar23 + dVar1 * dStack_80 * dVar21) -
           dVar6 * dVar22 * dVar21) - dVar5 * dVar1 * dVar23) - dVar17 * dVar20 * dVar2;
  auVar16._8_4_ = SUB84(dVar4,0);
  auVar16._0_8_ = dVar3;
  auVar16._12_4_ = (int)((ulong)dVar4 >> 0x20);
  (in_RDI->w).x = dVar3;
  (in_RDI->w).y = (double)auVar16._8_8_;
  (in_RDI->w).z =
       -dVar25 * dVar22 * dVar2 +
       -dVar17 * dVar1 * (double)uVar9 +
       ((dVar17 * (double)uVar7 * dVar2 + dVar22 * dVar6 * (double)uVar9 + dVar25 * dVar1 * dVar23)
       - dVar6 * (double)uVar7 * dVar23);
  (in_RDI->w).w =
       -dVar5 * (double)uVar7 * dVar2 +
       -dVar25 * dStack_290 * dVar21 +
       ((dVar25 * dVar20 * dVar2 + (double)uVar7 * dVar6 * dVar21 + dVar5 * dStack_290 * dStack_220)
       - dVar6 * dVar20 * dStack_220);
  return in_RDI;
}

Assistant:

constexpr linalg::mat<T,4,4> linalg::adjugate(const mat<T,4,4> & a) 
{
    return {{a.y.y*a.z.z*a.w.w + a.w.y*a.y.z*a.z.w + a.z.y*a.w.z*a.y.w - a.y.y*a.w.z*a.z.w - a.z.y*a.y.z*a.w.w - a.w.y*a.z.z*a.y.w,
             a.x.y*a.w.z*a.z.w + a.z.y*a.x.z*a.w.w + a.w.y*a.z.z*a.x.w - a.w.y*a.x.z*a.z.w - a.z.y*a.w.z*a.x.w - a.x.y*a.z.z*a.w.w,
             a.x.y*a.y.z*a.w.w + a.w.y*a.x.z*a.y.w + a.y.y*a.w.z*a.x.w - a.x.y*a.w.z*a.y.w - a.y.y*a.x.z*a.w.w - a.w.y*a.y.z*a.x.w,
             a.x.y*a.z.z*a.y.w + a.y.y*a.x.z*a.z.w + a.z.y*a.y.z*a.x.w - a.x.y*a.y.z*a.z.w - a.z.y*a.x.z*a.y.w - a.y.y*a.z.z*a.x.w},
            {a.y.z*a.w.w*a.z.x + a.z.z*a.y.w*a.w.x + a.w.z*a.z.w*a.y.x - a.y.z*a.z.w*a.w.x - a.w.z*a.y.w*a.z.x - a.z.z*a.w.w*a.y.x,
             a.x.z*a.z.w*a.w.x + a.w.z*a.x.w*a.z.x + a.z.z*a.w.w*a.x.x - a.x.z*a.w.w*a.z.x - a.z.z*a.x.w*a.w.x - a.w.z*a.z.w*a.x.x,
             a.x.z*a.w.w*a.y.x + a.y.z*a.x.w*a.w.x + a.w.z*a.y.w*a.x.x - a.x.z*a.y.w*a.w.x - a.w.z*a.x.w*a.y.x - a.y.z*a.w.w*a.x.x,
             a.x.z*a.y.w*a.z.x + a.z.z*a.x.w*a.y.x + a.y.z*a.z.w*a.x.x - a.x.z*a.z.w*a.y.x - a.y.z*a.x.w*a.z.x - a.z.z*a.y.w*a.x.x},
            {a.y.w*a.z.x*a.w.y + a.w.w*a.y.x*a.z.y + a.z.w*a.w.x*a.y.y - a.y.w*a.w.x*a.z.y - a.z.w*a.y.x*a.w.y - a.w.w*a.z.x*a.y.y,
             a.x.w*a.w.x*a.z.y + a.z.w*a.x.x*a.w.y + a.w.w*a.z.x*a.x.y - a.x.w*a.z.x*a.w.y - a.w.w*a.x.x*a.z.y - a.z.w*a.w.x*a.x.y,
             a.x.w*a.y.x*a.w.y + a.w.w*a.x.x*a.y.y + a.y.w*a.w.x*a.x.y - a.x.w*a.w.x*a.y.y - a.y.w*a.x.x*a.w.y - a.w.w*a.y.x*a.x.y,
             a.x.w*a.z.x*a.y.y + a.y.w*a.x.x*a.z.y + a.z.w*a.y.x*a.x.y - a.x.w*a.y.x*a.z.y - a.z.w*a.x.x*a.y.y - a.y.w*a.z.x*a.x.y},
            {a.y.x*a.w.y*a.z.z + a.z.x*a.y.y*a.w.z + a.w.x*a.z.y*a.y.z - a.y.x*a.z.y*a.w.z - a.w.x*a.y.y*a.z.z - a.z.x*a.w.y*a.y.z,
             a.x.x*a.z.y*a.w.z + a.w.x*a.x.y*a.z.z + a.z.x*a.w.y*a.x.z - a.x.x*a.w.y*a.z.z - a.z.x*a.x.y*a.w.z - a.w.x*a.z.y*a.x.z,
             a.x.x*a.w.y*a.y.z + a.y.x*a.x.y*a.w.z + a.w.x*a.y.y*a.x.z - a.x.x*a.y.y*a.w.z - a.w.x*a.x.y*a.y.z - a.y.x*a.w.y*a.x.z,
             a.x.x*a.y.y*a.z.z + a.z.x*a.x.y*a.y.z + a.y.x*a.z.y*a.x.z - a.x.x*a.z.y*a.y.z - a.y.x*a.x.y*a.z.z - a.z.x*a.y.y*a.x.z}}; 
}